

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::save_load_online_state<sparse_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,gd *g,stringstream *msg,
               sparse_parameters *weights)

{
  stringstream *psVar1;
  float fVar2;
  uint32_t uVar3;
  size_t sVar4;
  size_t sVar5;
  weight *pwVar6;
  ostream *poVar7;
  vw_exception *this;
  long lVar8;
  _Hash_node_base *p_Var9;
  undefined7 in_register_00000011;
  uint64_t *data;
  __node_base *p_Var10;
  size_t sStack_200;
  uint32_t old_i;
  uint64_t i;
  stringstream *local_1e8;
  vw *local_1e0;
  string local_1d8;
  weight buff [4];
  ostream local_1a8;
  
  local_1e8 = (stringstream *)(1L << ((byte)all->num_bits & 0x3f));
  i = 0;
  old_i = 0;
  local_1e0 = all;
  if ((int)CONCAT71(in_register_00000011,read) == 0) {
    p_Var10 = &(weights->_map)._M_h._M_before_begin;
    psVar1 = msg + 0x10;
    local_1e8 = msg;
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      fVar2 = *(float *)&(*(_Hash_node_base **)
                           &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)->_M_nxt;
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        i = (ulong)p_Var10[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f);
        std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
        if (local_1e0->num_bits < 0x1f) {
          old_i = (uint32_t)i;
          data = (uint64_t *)&old_i;
          sStack_200 = 4;
        }
        else {
          data = &i;
          sStack_200 = 8;
        }
        bin_text_write_fixed(model_file,(char *)data,sStack_200,msg,text);
        if (g == (gd *)0x0) {
LAB_0014fb8b:
          poVar7 = std::operator<<((ostream *)psVar1,":");
          p_Var9 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor
          ;
          sStack_200 = 4;
        }
        else {
          if (g->adaptive == false) {
            if (g->normalized == false) goto LAB_0014fb8b;
          }
          else if (g->normalized != false) {
            poVar7 = std::operator<<((ostream *)psVar1,":");
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               (poVar7,*(float *)&(*(_Hash_node_base **)
                                                    &((_Prime_rehash_policy *)(p_Var10 + 2))->
                                                     _M_max_load_factor)->_M_nxt);
            poVar7 = std::operator<<(poVar7," ");
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               (poVar7,*(float *)((long)&(*(_Hash_node_base **)
                                                           &((_Prime_rehash_policy *)(p_Var10 + 2))
                                                            ->_M_max_load_factor)->_M_nxt + 4));
            poVar7 = std::operator<<(poVar7," ");
            p_Var9 = *(_Hash_node_base **)
                      &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor + 1;
            sStack_200 = 0xc;
            goto LAB_0014fba0;
          }
          poVar7 = std::operator<<((ostream *)psVar1,":");
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             (poVar7,*(float *)&(*(_Hash_node_base **)
                                                  &((_Prime_rehash_policy *)(p_Var10 + 2))->
                                                   _M_max_load_factor)->_M_nxt);
          poVar7 = std::operator<<(poVar7," ");
          p_Var9 = (_Hash_node_base *)
                   ((long)&(*(_Hash_node_base **)
                             &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)->_M_nxt +
                   4);
          sStack_200 = 8;
        }
LAB_0014fba0:
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(float *)&p_Var9->_M_nxt);
        std::operator<<(poVar7,"\n");
        msg = local_1e8;
        bin_text_write_fixed
                  (model_file,
                   (char *)*(_Hash_node_base **)
                            &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor,sStack_200,
                   local_1e8,text);
      }
    }
  }
  else {
    do {
      if (local_1e0->num_bits < 0x1f) {
        sVar4 = io_buf::bin_read_fixed(model_file,(char *)&old_i,4,"");
        i = (uint64_t)old_i;
      }
      else {
        sVar4 = io_buf::bin_read_fixed(model_file,(char *)&i,8,"");
      }
      if (sVar4 == 0) {
        return;
      }
      if (local_1e8 <= i) {
        std::__cxx11::stringstream::stringstream((stringstream *)buff);
        poVar7 = std::operator<<(&local_1a8,"Model content is corrupted, weight vector index ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7," must be less than total vector length ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd.cc"
                   ,0x314,&local_1d8);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      buff[0] = 0.0;
      buff[1] = 0.0;
      buff[2] = 0.0;
      buff[3] = 0.0;
      sVar5 = 4;
      if (g != (gd *)0x0) {
        if (g->adaptive == false) {
          if (g->normalized != false) goto LAB_0014f9f6;
        }
        else {
          sVar5 = 0xc;
          if (g->normalized == false) {
LAB_0014f9f6:
            sVar5 = 8;
          }
        }
      }
      sVar5 = io_buf::bin_read_fixed(model_file,(char *)buff,sVar5,"");
      uVar3 = weights->_stride_shift;
      pwVar6 = sparse_parameters::strided_index(weights,i);
      for (lVar8 = 0; 1L << ((byte)uVar3 & 0x3f) != lVar8; lVar8 = lVar8 + 1) {
        pwVar6[lVar8] = buff[lVar8];
      }
    } while (sVar4 + sVar5 != 0);
  }
  return;
}

Assistant:

void save_load_online_state(vw& all, io_buf& model_file, bool read, bool text, gd* g, stringstream& msg, T& weights)
{
  uint64_t length = (uint64_t)1 << all.num_bits;

  uint64_t i = 0;
  uint32_t old_i = 0;
  size_t brw = 1;

  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight buff[4] = {0, 0, 0, 0};
        if (g == NULL || (!g->adaptive && !g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]), "");
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 2, "");
        else  // adaptive and normalized
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 3, "");
        uint32_t stride = 1 << weights.stride_shift();
        weight* v = &weights.strided_index(i);
        for (size_t i = 0; i < stride; i++) v[i] = buff[i];
      }
    } while (brw > 0);
  else  // write binary or text
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        msg << i;
        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        if (g == nullptr || (!g->adaptive && !g->normalized))
        {
          msg << ":" << *v << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
        }
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
        {
          // either adaptive or normalized
          msg << ":" << *v << " " << (&(*v))[1] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 2 * sizeof(*v), msg, text);
        }
        else
        {
          // adaptive and normalized
          msg << ":" << *v << " " << (&(*v))[1] << " " << (&(*v))[2] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 3 * sizeof(*v), msg, text);
        }
      }
}